

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O0

void * chck_pool_add(chck_pool *pool,void *data,size_t *out_index)

{
  void *pvVar1;
  void *p;
  size_t local_30;
  size_t slot;
  size_t *out_index_local;
  void *data_local;
  chck_pool *pool_local;
  
  slot = (size_t)out_index;
  out_index_local = (size_t *)data;
  data_local = pool;
  if (pool == (chck_pool *)0x0) {
    __assert_fail("pool",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c"
                  ,0x173,"void *chck_pool_add(struct chck_pool *, const void *, size_t *)");
  }
  local_30 = pool_get_free_slot(pool);
  p._7_1_ = 1;
  pvVar1 = pool_buffer_add((chck_pool_buffer *)((long)data_local + 0x30),(void *)((long)&p + 7),
                           local_30 * *(long *)((long)data_local + 0x40),(size_t *)0x0);
  if (pvVar1 == (void *)0x0) {
    pool_local = (chck_pool *)0x0;
  }
  else {
    pool_local = (chck_pool *)
                 pool_buffer_add((chck_pool_buffer *)data_local,out_index_local,
                                 local_30 * *(long *)((long)data_local + 0x10),(size_t *)slot);
    if (pool_local == (chck_pool *)0x0) {
      pool_buffer_remove((chck_pool_buffer *)((long)data_local + 0x30),
                         local_30 * *(long *)((long)data_local + 0x40),pool_get_used,data_local);
      pool_local = (chck_pool *)0x0;
    }
  }
  return pool_local;
}

Assistant:

void*
chck_pool_add(struct chck_pool *pool, const void *data, size_t *out_index)
{
   assert(pool);
   const size_t slot = pool_get_free_slot(pool);

   if (!pool_buffer_add(&pool->map, (bool[]){true}, slot * pool->map.member, NULL))
      return NULL;

   void *p;
   if (!(p = pool_buffer_add(&pool->items, data, slot * pool->items.member, out_index))) {
      pool_buffer_remove(&pool->map, slot * pool->map.member, pool_get_used, pool);
      return NULL;
   }

   return p;
}